

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

void tinyformat::
     format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int,int,double,unsigned_long,std::__cxx11::string,double,double,unsigned_int,std::__cxx11::string>
               (ostream *out,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,int *args_3
               ,int *args_4,double *args_5,unsigned_long *args_6,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7,
               double *args_8,double *args_9,uint *args_10,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_11)

{
  long in_FS_OFFSET;
  FormatArg local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  code *local_108;
  code *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  code *local_f0;
  code *local_e8;
  int *local_e0;
  code *local_d8;
  code *local_d0;
  int *local_c8;
  code *local_c0;
  code *local_b8;
  double *local_b0;
  code *local_a8;
  code *local_a0;
  unsigned_long *local_98;
  code *local_90;
  code *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  code *local_78;
  code *local_70;
  double *local_68;
  code *local_60;
  code *local_58;
  double *local_50;
  code *local_48;
  code *local_40;
  uint *local_38;
  code *local_30;
  code *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  code *local_18;
  code *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_128.m_formatImpl = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_128.m_toIntImpl = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_108 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_100 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_f0 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_e8 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_d8 = detail::FormatArg::formatImpl<int>;
  local_d0 = detail::FormatArg::toIntImpl<int>;
  local_c8 = args_4;
  local_c0 = detail::FormatArg::formatImpl<int>;
  local_b8 = detail::FormatArg::toIntImpl<int>;
  local_b0 = args_5;
  local_a8 = detail::FormatArg::formatImpl<double>;
  local_a0 = detail::FormatArg::toIntImpl<double>;
  local_98 = args_6;
  local_90 = detail::FormatArg::formatImpl<unsigned_long>;
  local_88 = detail::FormatArg::toIntImpl<unsigned_long>;
  local_80 = args_7;
  local_78 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_70 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_68 = args_8;
  local_60 = detail::FormatArg::formatImpl<double>;
  local_58 = detail::FormatArg::toIntImpl<double>;
  local_50 = args_9;
  local_48 = detail::FormatArg::formatImpl<double>;
  local_40 = detail::FormatArg::toIntImpl<double>;
  local_38 = args_10;
  local_30 = detail::FormatArg::formatImpl<unsigned_int>;
  local_28 = detail::FormatArg::toIntImpl<unsigned_int>;
  local_20 = args_11;
  local_18 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_10 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_128.m_value = args;
  local_110 = args_1;
  local_f8 = args_2;
  local_e0 = args_3;
  detail::formatImpl(out,fmt,&local_128,0xc);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}